

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  ulong uVar2;
  char **ppcVar3;
  char *pcVar4;
  byte *pbVar5;
  uint local_74;
  uint local_64;
  uint local_5c;
  uint local_54;
  uint local_44;
  size_t n;
  int tok;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (end <= ptr) {
    return -4;
  }
  nextTokPtr_local = (char **)end;
  if (((long)end - (long)ptr & 1U) != 0) {
    uVar2 = (long)end - (long)ptr & 0xfffffffffffffffe;
    if (uVar2 == 0) {
      return -1;
    }
    nextTokPtr_local = (char **)(ptr + uVar2);
  }
  if (ptr[1] == '\0') {
    local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  }
  else {
    local_44 = unicode_byte_type(ptr[1],*ptr);
  }
  switch(local_44) {
  case 2:
    pbVar5 = (byte *)(ptr + 2);
    if ((long)nextTokPtr_local - (long)pbVar5 < 2) {
      enc_local._4_4_ = -1;
    }
    else {
      if (ptr[3] == '\0') {
        local_54 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
      }
      else {
        local_54 = unicode_byte_type(ptr[3],*pbVar5);
      }
      if (2 < local_54 - 5) {
        if (local_54 == 0xf) {
          iVar1 = little2_scanPi(enc,ptr + 4,(char *)nextTokPtr_local,nextTokPtr);
          return iVar1;
        }
        if (local_54 == 0x10) {
          iVar1 = little2_scanDecl(enc,ptr + 4,(char *)nextTokPtr_local,nextTokPtr);
          return iVar1;
        }
        if (((local_54 != 0x16) && (local_54 != 0x18)) && (local_54 != 0x1d)) {
          *nextTokPtr = (char *)pbVar5;
          return 0;
        }
      }
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0x1d;
    }
    break;
  default:
switchD_0065c8ae_caseD_3:
    *nextTokPtr = ptr;
    enc_local._4_4_ = 0;
    break;
  case 4:
    pcVar4 = ptr + 2;
    if ((long)nextTokPtr_local - (long)pcVar4 < 2) {
      enc_local._4_4_ = -0x1a;
    }
    else {
      if ((ptr[3] == '\0') && (*pcVar4 == ']')) {
        if ((long)nextTokPtr_local - (long)pcVar4 < 4) {
          return -1;
        }
        if ((ptr[5] == '\0') && (ptr[4] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar4;
      enc_local._4_4_ = 0x1a;
    }
    break;
  case 5:
    if ((long)nextTokPtr_local - (long)ptr < 2) {
      enc_local._4_4_ = -2;
    }
    else {
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
    }
    break;
  case 6:
    if ((long)nextTokPtr_local - (long)ptr < 3) {
      enc_local._4_4_ = -2;
    }
    else {
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
    }
    break;
  case 7:
    if ((long)nextTokPtr_local - (long)ptr < 4) {
      enc_local._4_4_ = -2;
    }
    else {
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
    }
    break;
  case 9:
    if ((char **)(ptr + 2) == nextTokPtr_local) {
      *nextTokPtr = (char *)nextTokPtr_local;
      return -0xf;
    }
  case 10:
  case 0x15:
    end_local = ptr;
    do {
      while( true ) {
        pbVar5 = (byte *)(end_local + 2);
        if ((long)nextTokPtr_local - (long)pbVar5 < 2) {
          *nextTokPtr = (char *)pbVar5;
          return 0xf;
        }
        if (end_local[3] == '\0') {
          local_5c = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
        }
        else {
          local_5c = unicode_byte_type(end_local[3],*pbVar5);
        }
        if (local_5c == 9) break;
        end_local = (char *)pbVar5;
        if ((local_5c != 10) && (local_5c != 0x15)) goto LAB_0065cad7;
      }
      ppcVar3 = (char **)(end_local + 4);
      end_local = (char *)pbVar5;
    } while (ppcVar3 != nextTokPtr_local);
LAB_0065cad7:
    *nextTokPtr = (char *)pbVar5;
    enc_local._4_4_ = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    enc_local._4_4_ = 0x11;
    break;
  case 0xc:
    enc_local._4_4_ = little2_scanLit(0xc,enc,ptr + 2,(char *)nextTokPtr_local,nextTokPtr);
    break;
  case 0xd:
    enc_local._4_4_ = little2_scanLit(0xd,enc,ptr + 2,(char *)nextTokPtr_local,nextTokPtr);
    break;
  case 0x13:
    enc_local._4_4_ = little2_scanPoundName(enc,ptr + 2,(char *)nextTokPtr_local,nextTokPtr);
    break;
  case 0x14:
    *nextTokPtr = ptr + 2;
    enc_local._4_4_ = 0x19;
    break;
  case 0x16:
  case 0x18:
    n._4_4_ = 0x12;
    goto LAB_0065cf30;
  case 0x19:
  case 0x1a:
  case 0x1b:
    n._4_4_ = 0x13;
    goto LAB_0065cf30;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)ptr[1]] * 8 + ((int)(uint)(byte)*ptr >> 5))]
        & 1 << (*ptr & 0x1fU)) == 0) {
      if ((namingBitmap
           [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)ptr[1]] * 8 +
                 ((int)(uint)(byte)*ptr >> 5))] & 1 << (*ptr & 0x1fU)) == 0)
      goto switchD_0065c8ae_caseD_3;
      n._4_4_ = 0x13;
    }
    else {
      n._4_4_ = 0x12;
    }
LAB_0065cf30:
    end_local = ptr + 2;
    while (1 < (long)nextTokPtr_local - (long)end_local) {
      if (end_local[1] == '\0') {
        local_74 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
      }
      else {
        local_74 = unicode_byte_type(end_local[1],*end_local);
      }
      switch(local_74) {
      case 5:
        if ((long)nextTokPtr_local - (long)end_local < 2) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      case 6:
        if ((long)nextTokPtr_local - (long)end_local < 3) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      case 7:
        if ((long)nextTokPtr_local - (long)end_local < 4) {
          return -2;
        }
        *nextTokPtr = end_local;
        return 0;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = end_local;
        return n._4_4_;
      case 0xf:
        if (n._4_4_ == 0x13) {
          *nextTokPtr = end_local;
          return 0;
        }
        *nextTokPtr = end_local + 2;
        return 0x1e;
      case 0x1d:
        if ((namingBitmap
             [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)end_local[1]] * 8 +
                   ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        end_local = end_local + 2;
        break;
      case 0x21:
        if (n._4_4_ == 0x13) {
          *nextTokPtr = end_local;
          return 0;
        }
        *nextTokPtr = end_local + 2;
        return 0x1f;
      case 0x22:
        if (n._4_4_ == 0x13) {
          *nextTokPtr = end_local;
          return 0;
        }
        *nextTokPtr = end_local + 2;
        return 0x20;
      }
    }
    enc_local._4_4_ = -n._4_4_;
    break;
  case 0x1e:
    enc_local._4_4_ = little2_scanPercent(enc,ptr + 2,(char *)nextTokPtr_local,nextTokPtr);
    break;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    enc_local._4_4_ = 0x17;
    break;
  case 0x20:
    pbVar5 = (byte *)(ptr + 2);
    if ((long)nextTokPtr_local - (long)pbVar5 < 2) {
      enc_local._4_4_ = -0x18;
    }
    else {
      if (ptr[3] == '\0') {
        local_64 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
      }
      else {
        local_64 = unicode_byte_type(ptr[3],*pbVar5);
      }
      switch(local_64) {
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = (char *)pbVar5;
        enc_local._4_4_ = 0x18;
        break;
      default:
        *nextTokPtr = (char *)pbVar5;
        enc_local._4_4_ = 0;
        break;
      case 0xf:
        *nextTokPtr = ptr + 4;
        enc_local._4_4_ = 0x23;
        break;
      case 0x21:
        *nextTokPtr = ptr + 4;
        enc_local._4_4_ = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 4;
        enc_local._4_4_ = 0x25;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 2;
    enc_local._4_4_ = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    enc_local._4_4_ = 0x15;
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}